

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

wchar_t * __thiscall
fmt::v6::internal::float_writer<wchar_t>::prettify<wchar_t*>
          (float_writer<wchar_t> *this,wchar_t *it)

{
  wchar_t *pwVar1;
  int iVar2;
  int *in_RSI;
  long *in_RDI;
  bool bVar3;
  int num_digits_1;
  int num_zeros_3;
  int num_zeros_2;
  int num_digits;
  int num_zeros_1;
  bool trailing_zeros;
  int num_zeros;
  int full_exp;
  char *in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffffa0;
  uint uVar4;
  undefined1 in_stack_ffffffffffffffa4;
  undefined1 in_stack_ffffffffffffffa5;
  undefined1 in_stack_ffffffffffffffa6;
  char cVar5;
  undefined1 in_stack_ffffffffffffffa7;
  byte bVar6;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int local_48;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_38;
  wchar_t *local_18;
  wchar_t *local_8;
  
  iVar2 = (int)in_RDI[1] + *(int *)((long)in_RDI + 0xc);
  if ((char)*(undefined4 *)((long)in_RDI + 0x1c) == '\x01') {
    *in_RSI = (int)*(char *)*in_RDI;
    bVar6 = 0;
    if (0 < (int)in_RDI[3] - (int)in_RDI[1]) {
      bVar6 = (byte)(*(uint *)((long)in_RDI + 0x1c) >> 0x15) & 1;
    }
    if ((1 < (int)in_RDI[1]) || (bVar6 != 0)) {
      in_RSI[1] = (int)in_RDI[4];
    }
    local_18 = copy_str<wchar_t,_const_char_*,_wchar_t_*,_0>
                         ((char *)CONCAT17(bVar6,CONCAT16(in_stack_ffffffffffffffa6,
                                                          CONCAT15(in_stack_ffffffffffffffa5,
                                                                   CONCAT14(
                                                  in_stack_ffffffffffffffa4,
                                                  in_stack_ffffffffffffffa0)))),
                          in_stack_ffffffffffffff98,(wchar_t *)0x27caa1);
    if (bVar6 != 0) {
      local_18 = std::fill_n<wchar_t*,int,wchar_t>
                           ((wchar_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                            ,in_stack_ffffffffffffffbc,
                            (wchar_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                           );
    }
    cVar5 = 'E';
    if ((*(uint *)((long)in_RDI + 0x1c) & 0x10000) == 0) {
      cVar5 = 'e';
    }
    *local_18 = (int)cVar5;
    local_8 = write_exponent<wchar_t,wchar_t*>(iVar2 + -1,local_18 + 1);
  }
  else {
    if (iVar2 < (int)in_RDI[1]) {
      if (iVar2 < 1) {
        *in_RSI = 0x30;
        iVar2 = -iVar2;
        if ((-1 < (int)in_RDI[3]) && ((int)in_RDI[3] < iVar2)) {
          iVar2 = (int)in_RDI[3];
        }
        local_48 = (int)in_RDI[1];
        uVar4 = in_stack_ffffffffffffffa0;
        if ((*(uint *)((long)in_RDI + 0x1c) >> 0x15 & 1) == 0) {
          while( true ) {
            uVar4 = in_stack_ffffffffffffffa0 & 0xffffff;
            if (0 < local_48) {
              uVar4 = CONCAT13(*(char *)(*in_RDI + (long)(local_48 + -1)) == '0',
                               (int3)in_stack_ffffffffffffffa0);
            }
            if ((char)(uVar4 >> 0x18) == '\0') break;
            local_48 = local_48 + -1;
            in_stack_ffffffffffffffa0 = uVar4;
          }
        }
        if ((iVar2 != 0) || (local_18 = in_RSI + 1, local_48 != 0)) {
          in_RSI[1] = *(wchar_t *)(in_RDI + 4);
          std::fill_n<wchar_t*,int,wchar_t>
                    ((wchar_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),iVar2,
                     (wchar_t *)CONCAT44(0x30,in_stack_ffffffffffffffb0));
          local_18 = copy_str<wchar_t,_const_char_*,_wchar_t_*,_0>
                               ((char *)CONCAT17(in_stack_ffffffffffffffa7,
                                                 CONCAT16(in_stack_ffffffffffffffa6,
                                                          CONCAT15(in_stack_ffffffffffffffa5,
                                                                   CONCAT14(
                                                  in_stack_ffffffffffffffa4,uVar4)))),
                                in_stack_ffffffffffffff98,(wchar_t *)0x27ceb1);
        }
      }
      else {
        pwVar1 = copy_str<wchar_t,_const_char_*,_wchar_t_*,_0>
                           ((char *)CONCAT17(in_stack_ffffffffffffffa7,
                                             CONCAT16(in_stack_ffffffffffffffa6,
                                                      CONCAT15(in_stack_ffffffffffffffa5,
                                                               CONCAT14(in_stack_ffffffffffffffa4,
                                                                        in_stack_ffffffffffffffa0)))
                                            ),in_stack_ffffffffffffff98,(wchar_t *)0x27cc56);
        if ((*(uint *)((long)in_RDI + 0x1c) >> 0x15 & 1) == 0) {
          local_38 = (int)in_RDI[1];
          while( true ) {
            bVar3 = false;
            if (iVar2 < local_38) {
              bVar3 = *(char *)(*in_RDI + (long)(local_38 + -1)) == '0';
            }
            if (!bVar3) break;
            local_38 = local_38 + -1;
          }
          if (local_38 != iVar2) {
            *pwVar1 = *(wchar_t *)(in_RDI + 4);
          }
          pwVar1 = copy_str<wchar_t,_const_char_*,_wchar_t_*,_0>
                             ((char *)CONCAT17(in_stack_ffffffffffffffa7,
                                               CONCAT16(in_stack_ffffffffffffffa6,
                                                        CONCAT15(in_stack_ffffffffffffffa5,
                                                                 (uint5)in_stack_ffffffffffffffa0)))
                              ,in_stack_ffffffffffffff98,(wchar_t *)0x27cd14);
          return pwVar1;
        }
        *pwVar1 = *(wchar_t *)(in_RDI + 4);
        local_18 = copy_str<wchar_t,_const_char_*,_wchar_t_*,_0>
                             ((char *)CONCAT17(in_stack_ffffffffffffffa7,
                                               CONCAT16(in_stack_ffffffffffffffa6,
                                                        CONCAT15(in_stack_ffffffffffffffa5,
                                                                 CONCAT14(in_stack_ffffffffffffffa4,
                                                                          in_stack_ffffffffffffffa0)
                                                                ))),in_stack_ffffffffffffff98,
                              (wchar_t *)0x27cd58);
        if ((int)in_RDI[1] < (int)in_RDI[3]) {
          local_18 = std::fill_n<wchar_t*,int,wchar_t>
                               ((wchar_t *)CONCAT44((int)in_RDI[3] - (int)in_RDI[1],0x30),
                                in_stack_ffffffffffffffbc,
                                (wchar_t *)
                                CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
        }
      }
    }
    else {
      copy_str<wchar_t,_const_char_*,_wchar_t_*,_0>
                ((char *)CONCAT17(in_stack_ffffffffffffffa7,
                                  CONCAT16(in_stack_ffffffffffffffa6,
                                           CONCAT15(in_stack_ffffffffffffffa5,
                                                    CONCAT14(in_stack_ffffffffffffffa4,
                                                             in_stack_ffffffffffffffa0)))),
                 in_stack_ffffffffffffff98,(wchar_t *)0x27cb59);
      pwVar1 = std::fill_n<wchar_t*,int,wchar_t>
                         ((wchar_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffbc,
                          (wchar_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      local_18 = pwVar1;
      if ((*(uint *)((long)in_RDI + 0x1c) >> 0x15 & 1) != 0) {
        *pwVar1 = *(wchar_t *)(in_RDI + 4);
        if ((int)in_RDI[3] - iVar2 < 1) {
          local_18 = pwVar1 + 1;
          if ((char)*(undefined4 *)((long)in_RDI + 0x1c) != '\x02') {
            local_18 = pwVar1 + 2;
            pwVar1[1] = L'0';
          }
          return local_18;
        }
        local_18 = std::fill_n<wchar_t*,int,wchar_t>
                             ((wchar_t *)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                              in_stack_ffffffffffffffbc,
                              (wchar_t *)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      }
    }
    local_8 = local_18;
  }
  return local_8;
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      bool trailing_zeros = num_zeros > 0 && specs_.trailing_zeros;
      if (num_digits_ > 1 || trailing_zeros) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (trailing_zeros)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      it = copy_str<Char>(digits_, digits_ + num_digits_, it);
      it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      if (specs_.trailing_zeros) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
        if (num_zeros > 1000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      it = copy_str<Char>(digits_, digits_ + full_exp, it);
      if (!specs_.trailing_zeros) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      if (specs_.precision >= 0 && specs_.precision < num_zeros)
        num_zeros = specs_.precision;
      int num_digits = num_digits_;
      if (!specs_.trailing_zeros)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }